

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::anon_unknown_14::FatalConditionHandler::handleSignal(int sig)

{
  char *pcVar1;
  int in_EDI;
  SignalDefs *def;
  size_t i;
  char *name;
  allocator local_41;
  string local_40 [32];
  int *local_20;
  ulong local_18;
  char *local_10;
  int local_4;
  
  local_10 = "<unknown signal>";
  local_18 = 0;
  do {
    if (5 < local_18) {
LAB_00111cac:
      local_4 = in_EDI;
      reset();
      pcVar1 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,pcVar1,&local_41);
      reportFatal((string *)i);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      raise(local_4);
      return;
    }
    local_20 = (int *)((anonymous_namespace)::signalDefs + local_18 * 0x10);
    if (in_EDI == *local_20) {
      local_10 = *(char **)((anonymous_namespace)::signalDefs + local_18 * 0x10 + 8);
      goto LAB_00111cac;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

static void handleSignal(int sig) {
            const char* name = "<unknown signal>";
            for(std::size_t i = 0; i < DOCTEST_COUNTOF(signalDefs); ++i) {
                SignalDefs& def = signalDefs[i];
                if(sig == def.id) {
                    name = def.name;
                    break;
                }
            }
            reset();
            reportFatal(name);
            raise(sig);
        }